

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

string * __thiscall
MPL::detail::ModelPackageImpl::setRootModel
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  JsonMap *pJVar1;
  bool bVar2;
  runtime_error *this_00;
  allocator<char> local_59;
  string *local_58;
  string local_50;
  
  pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
           _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_58 = description;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"rootModelIdentifier",&local_59);
  bVar2 = JsonMap::hasKey(pJVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar2) {
    addItem(__return_storage_ptr__,this,path,name,author,local_58);
    pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
             _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"rootModelIdentifier",&local_59);
    JsonMap::setString(pJVar1,&local_50,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"A root model already exists in this package");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string ModelPackageImpl::setRootModel(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("A root model already exists in this package");
    }
    
    auto identifier = addItem(path, name, author, description);
    m_manifest->setString(kModelPackageRootModelKey, identifier);
    return identifier;
}